

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeQADDInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  bool bVar1;
  DecodeStatus DVar2;
  uint64_t Address_00;
  uint64_t Address_01;
  uint64_t Address_02;
  
  if (Insn >> 0x1c == 0xf) {
    DVar2 = DecodeCPSInstruction(Inst,Insn,Address,Decoder);
    return DVar2;
  }
  DVar2 = DecodeGPRnopcRegisterClass(Inst,Insn >> 0xc & 0xf,Address,Decoder);
  bVar1 = true;
  if ((DVar2 != MCDisassembler_Success) && (DVar2 != MCDisassembler_SoftFail)) {
    bVar1 = false;
  }
  if (bVar1) {
    DVar2 = DecodeGPRnopcRegisterClass(Inst,Insn & 0xf,Address_00,Decoder);
    if (DVar2 == MCDisassembler_Fail) {
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if ((DVar2 != MCDisassembler_Success) && (DVar2 != MCDisassembler_SoftFail)) {
        bVar1 = false;
      }
    }
    if (bVar1) {
      DVar2 = DecodeGPRnopcRegisterClass(Inst,Insn >> 0x10 & 0xf,Address_01,Decoder);
      if (DVar2 == MCDisassembler_Fail) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
        if ((DVar2 != MCDisassembler_Success) && (DVar2 != MCDisassembler_SoftFail)) {
          bVar1 = false;
        }
      }
      if (bVar1) {
        DVar2 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_02,Decoder);
        DVar2 = (*(code *)(&DAT_0032c0cc + *(int *)(&DAT_0032c0cc + (ulong)DVar2 * 4)))();
        return DVar2;
      }
    }
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeQADDInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);

	if (pred == 0xF)
		return DecodeCPSInstruction(Inst, Insn, Address, Decoder);

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}